

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Check.cpp
# Opt level: O0

void __thiscall Check::~Check(Check *this)

{
  Check *this_local;
  
  (this->super_Transaction)._vptr_Transaction = (_func_int **)&PTR_display_00108d50;
  std::__cxx11::string::~string((string *)&this->accountNumber);
  std::__cxx11::string::~string((string *)&this->routingNumber);
  return;
}

Assistant:

Check::~Check(){}